

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteGroup
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  byte *pbVar5;
  uint8 *puVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  
  uVar8 = field_number << 3;
  if ((output->impl_).end_ <= output->cur_) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar6;
  }
  pbVar9 = output->cur_;
  bVar2 = (byte)uVar8;
  if (uVar8 < 0x80) {
    *pbVar9 = bVar2 | 3;
    pbVar9 = pbVar9 + 1;
  }
  else {
    *pbVar9 = bVar2 | 0x83;
    if (uVar8 < 0x4000) {
      pbVar9[1] = (byte)(uVar8 >> 7);
      pbVar9 = pbVar9 + 2;
    }
    else {
      pbVar9 = pbVar9 + 2;
      uVar7 = uVar8 >> 7;
      do {
        pbVar5 = pbVar9;
        pbVar5[-1] = (byte)uVar7 | 0x80;
        uVar3 = uVar7 >> 7;
        pbVar9 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar3;
      } while (bVar1);
      *pbVar5 = (byte)uVar3;
    }
  }
  output->cur_ = pbVar9;
  iVar4 = (*value->_vptr_MessageLite[0xe])(value,pbVar9,output);
  puVar6 = (uint8 *)CONCAT44(extraout_var,iVar4);
  output->cur_ = puVar6;
  if ((output->impl_).end_ <= puVar6) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,puVar6);
    output->cur_ = puVar6;
  }
  pbVar9 = output->cur_;
  if (uVar8 < 0x80) {
    *pbVar9 = bVar2 | 4;
    pbVar9 = pbVar9 + 1;
  }
  else {
    *pbVar9 = bVar2 | 0x84;
    if (uVar8 < 0x4000) {
      pbVar9[1] = (byte)(uVar8 >> 7);
      pbVar9 = pbVar9 + 2;
    }
    else {
      pbVar9 = pbVar9 + 2;
      uVar8 = uVar8 >> 7;
      do {
        pbVar5 = pbVar9;
        pbVar5[-1] = (byte)uVar8 | 0x80;
        uVar7 = uVar8 >> 7;
        pbVar9 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar7;
      } while (bVar1);
      *pbVar5 = (byte)uVar7;
    }
  }
  output->cur_ = pbVar9;
  return;
}

Assistant:

void WireFormatLite::WriteGroup(int field_number, const MessageLite& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  value.SerializeWithCachedSizes(output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}